

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQBG.cpp
# Opt level: O0

void __thiscall
FactoredQLastTimeStepOrQBG::FactoredQLastTimeStepOrQBG
          (FactoredQLastTimeStepOrQBG *this,PlanningUnitFactoredDecPOMDPDiscrete *puf)

{
  pointer puVar1;
  FactoredQLastTimeStepOrElse *in_RSI;
  PlanningUnitDecPOMDPDiscrete *in_RDI;
  PlanningUnitFactoredDecPOMDPDiscrete *in_stack_ffffffffffffffe0;
  void **in_stack_ffffffffffffffe8;
  
  QFunctionInterface::QFunctionInterface((QFunctionInterface *)in_RDI);
  QFunctionForDecPOMDPInterface::QFunctionForDecPOMDPInterface
            ((QFunctionForDecPOMDPInterface *)in_RDI,&PTR_PTR_00d09760);
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)
             &(in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_problem,
             &PTR_construction_vtable_152__00d09770);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit =
       (_func_int **)0xd094f8;
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit =
       (_func_int **)0xd094f8;
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit =
       (_func_int **)0xd094f8;
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_problem =
       (MultiAgentDecisionProcessInterface *)0xd09640;
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_problem =
       (MultiAgentDecisionProcessInterface *)0xd09640;
  puVar1 = (pointer)operator_new(0x60);
  QBG::QBG((QBG *)in_stack_ffffffffffffffe0,in_RDI);
  (in_RDI->super_PlanningUnitMADPDiscrete)._m_nrObservationHistories.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar1;
  *(undefined1 *)
   &(in_RDI->super_PlanningUnitMADPDiscrete)._m_nrObservationHistories.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  return;
}

Assistant:

FactoredQLastTimeStepOrQBG::
FactoredQLastTimeStepOrQBG(const PlanningUnitFactoredDecPOMDPDiscrete* puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QBG=new QBG(puf);
    _m_initialized = false;
}